

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

bool Search::should_print_update(vw *all,bool hit_new_pass)

{
  long *in_RDI;
  double dVar1;
  undefined1 local_a;
  
  dVar1 = shared_data::weighted_examples((shared_data *)*in_RDI);
  local_a = 0;
  if (((double)*(float *)(*in_RDI + 0x50) <= dVar1) &&
     (local_a = 0, (*(byte *)((long)in_RDI + 0x3439) & 1) == 0)) {
    local_a = *(byte *)((long)in_RDI + 0x9c) ^ 0xff;
  }
  return (bool)(local_a & 1);
}

Assistant:

bool should_print_update(vw& all, bool hit_new_pass = false)
{
  // uncomment to print out final loss after all examples processed
  // commented for now so that outputs matches make test

  if (PRINT_UPDATE_EVERY_EXAMPLE)
    return true;
  if (PRINT_UPDATE_EVERY_PASS && hit_new_pass)
    return true;
  return (all.sd->weighted_examples() >= all.sd->dump_interval) && !all.quiet && !all.bfgs;
}